

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void doWork(void)

{
  SurfaceMesh *this;
  allocator local_89;
  string local_88;
  string local_68;
  string local_48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_28;
  
  std::__cxx11::to_string(&local_48,param1);
  std::operator+(&local_28,"Computing Gaussian curvature.\nalso, parameter value = ",&local_48);
  std::__cxx11::string::string((string *)&local_68,"",&local_89);
  polyscope::warning(&local_28,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::~string((string *)&local_48);
  geometrycentral::surface::IntrinsicGeometryInterface::requireVertexGaussianCurvatures
            ((IntrinsicGeometryInterface *)
             geometry._M_t.
             super___uniq_ptr_impl<geometrycentral::surface::VertexPositionGeometry,_std::default_delete<geometrycentral::surface::VertexPositionGeometry>_>
             ._M_t.
             super__Tuple_impl<0UL,_geometrycentral::surface::VertexPositionGeometry_*,_std::default_delete<geometrycentral::surface::VertexPositionGeometry>_>
             .super__Head_base<0UL,_geometrycentral::surface::VertexPositionGeometry_*,_false>.
             _M_head_impl);
  this = psMesh;
  std::__cxx11::string::string((string *)&local_88,"curvature",(allocator *)&local_48);
  polyscope::SurfaceMesh::
  addVertexScalarQuantity<geometrycentral::MeshData<geometrycentral::surface::Vertex,double>>
            (this,&local_88,
             (MeshData<geometrycentral::surface::Vertex,_double> *)
             ((long)geometry._M_t.
                    super___uniq_ptr_impl<geometrycentral::surface::VertexPositionGeometry,_std::default_delete<geometrycentral::surface::VertexPositionGeometry>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_geometrycentral::surface::VertexPositionGeometry_*,_std::default_delete<geometrycentral::surface::VertexPositionGeometry>_>
                    .
                    super__Head_base<0UL,_geometrycentral::surface::VertexPositionGeometry_*,_false>
                    ._M_head_impl + 0x4c0),SYMMETRIC);
  std::__cxx11::string::~string((string *)&local_88);
  return;
}

Assistant:

void doWork() {
  polyscope::warning("Computing Gaussian curvature.\nalso, parameter value = " +
                     std::to_string(param1));

  geometry->requireVertexGaussianCurvatures();
  psMesh->addVertexScalarQuantity("curvature",
                                  geometry->vertexGaussianCurvatures,
                                  polyscope::DataType::SYMMETRIC);
}